

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::ListVector::Reserve(Vector *vector,idx_t required_capacity)

{
  VectorBuffer *in_RSI;
  VectorListBuffer *child_buffer;
  idx_t in_stack_00000068;
  VectorListBuffer *in_stack_00000070;
  
  shared_ptr<duckdb::VectorBuffer,_true>::operator->
            ((shared_ptr<duckdb::VectorBuffer,_true> *)in_RSI);
  VectorBuffer::Cast<duckdb::VectorListBuffer>(in_RSI);
  VectorListBuffer::Reserve(in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

void ListVector::Reserve(Vector &vector, idx_t required_capacity) {
	D_ASSERT(vector.GetType().id() == LogicalTypeId::LIST || vector.GetType().id() == LogicalTypeId::MAP);
	D_ASSERT(vector.GetVectorType() == VectorType::FLAT_VECTOR ||
	         vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(vector.auxiliary);
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::LIST_BUFFER);
	auto &child_buffer = vector.auxiliary->Cast<VectorListBuffer>();
	child_buffer.Reserve(required_capacity);
}